

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_minmax(lysp_yin_ctx *ctx,ly_stmt parent_stmt,ly_stmt cur_stmt,void *dest)

{
  uint16_t *local_60;
  uint16_t *local_58;
  uint16_t *local_50;
  LY_ERR ret___1;
  LY_ERR ret__;
  lysp_ext_instance **exts;
  uint16_t *flags;
  uint32_t *lim;
  void *dest_local;
  ly_stmt cur_stmt_local;
  ly_stmt parent_stmt_local;
  lysp_yin_ctx *ctx_local;
  
  if ((cur_stmt != LY_STMT_MAX_ELEMENTS) && (cur_stmt != LY_STMT_MIN_ELEMENTS)) {
    __assert_fail("cur_stmt == LY_STMT_MAX_ELEMENTS || cur_stmt == LY_STMT_MIN_ELEMENTS",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                  ,0x5bc,
                  "LY_ERR yin_parse_minmax(struct lysp_yin_ctx *, enum ly_stmt, enum ly_stmt, void *)"
                 );
  }
  if ((((parent_stmt != LY_STMT_LEAF_LIST) && (parent_stmt != LY_STMT_REFINE)) &&
      (parent_stmt != LY_STMT_LIST)) && (parent_stmt != LY_STMT_DEVIATE)) {
    __assert_fail("parent_stmt == LY_STMT_LEAF_LIST || parent_stmt == LY_STMT_REFINE || parent_stmt == LY_STMT_LIST || parent_stmt == LY_STMT_DEVIATE"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                  ,0x5be,
                  "LY_ERR yin_parse_minmax(struct lysp_yin_ctx *, enum ly_stmt, enum ly_stmt, void *)"
                 );
  }
  if (parent_stmt == LY_STMT_LEAF_LIST) {
    if (cur_stmt == LY_STMT_MAX_ELEMENTS) {
      local_50 = (uint16_t *)((long)dest + 0xcc);
    }
    else {
      local_50 = (uint16_t *)((long)dest + 200);
    }
    flags = local_50;
    exts = (lysp_ext_instance **)((long)dest + 10);
    _ret___1 = (lysp_ext_instance **)((long)dest + 0x38);
  }
  else if (parent_stmt == LY_STMT_REFINE) {
    if (cur_stmt == LY_STMT_MAX_ELEMENTS) {
      local_58 = (uint16_t *)((long)dest + 0x3c);
    }
    else {
      local_58 = (uint16_t *)((long)dest + 0x38);
    }
    flags = local_58;
    exts = (lysp_ext_instance **)((long)dest + 0x48);
    _ret___1 = (lysp_ext_instance **)((long)dest + 0x40);
  }
  else if (parent_stmt == LY_STMT_LIST) {
    if (cur_stmt == LY_STMT_MAX_ELEMENTS) {
      local_60 = (uint16_t *)((long)dest + 0x8c);
    }
    else {
      local_60 = (uint16_t *)((long)dest + 0x88);
    }
    flags = local_60;
    exts = (lysp_ext_instance **)((long)dest + 10);
    _ret___1 = (lysp_ext_instance **)((long)dest + 0x38);
  }
  else {
    flags = *dest;
    exts = *(lysp_ext_instance ***)((long)dest + 8);
    _ret___1 = *(lysp_ext_instance ***)((long)dest + 0x10);
  }
  if (cur_stmt == LY_STMT_MAX_ELEMENTS) {
    ctx_local._4_4_ = yin_parse_maxelements(ctx,(uint32_t *)flags,(uint16_t *)exts,_ret___1);
  }
  else {
    ctx_local._4_4_ = yin_parse_minelements(ctx,(uint32_t *)flags,(uint16_t *)exts,_ret___1);
  }
  if (ctx_local._4_4_ == LY_SUCCESS) {
    ctx_local._4_4_ = LY_SUCCESS;
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
yin_parse_minmax(struct lysp_yin_ctx *ctx, enum ly_stmt parent_stmt, enum ly_stmt cur_stmt, void *dest)
{
    uint32_t *lim;
    uint16_t *flags;
    struct lysp_ext_instance **exts;

    assert(cur_stmt == LY_STMT_MAX_ELEMENTS || cur_stmt == LY_STMT_MIN_ELEMENTS);
    assert(parent_stmt == LY_STMT_LEAF_LIST || parent_stmt == LY_STMT_REFINE || parent_stmt == LY_STMT_LIST ||
            parent_stmt == LY_STMT_DEVIATE);

    if (parent_stmt == LY_STMT_LEAF_LIST) {
        lim = (cur_stmt == LY_STMT_MAX_ELEMENTS) ? &((struct lysp_node_leaflist *)dest)->max : &((struct lysp_node_leaflist *)dest)->min;
        flags = &((struct lysp_node_leaflist *)dest)->flags;
        exts = &((struct lysp_node_leaflist *)dest)->exts;
    } else if (parent_stmt == LY_STMT_REFINE) {
        lim = (cur_stmt == LY_STMT_MAX_ELEMENTS) ? &((struct lysp_refine *)dest)->max : &((struct lysp_refine *)dest)->min;
        flags = &((struct lysp_refine *)dest)->flags;
        exts = &((struct lysp_refine *)dest)->exts;
    } else if (parent_stmt == LY_STMT_LIST) {
        lim = (cur_stmt == LY_STMT_MAX_ELEMENTS) ? &((struct lysp_node_list *)dest)->max : &((struct lysp_node_list *)dest)->min;
        flags = &((struct lysp_node_list *)dest)->flags;
        exts = &((struct lysp_node_list *)dest)->exts;
    } else {
        lim = ((struct minmax_dev_meta *)dest)->lim;
        flags = ((struct minmax_dev_meta *)dest)->flags;
        exts = ((struct minmax_dev_meta *)dest)->exts;
    }

    if (cur_stmt == LY_STMT_MAX_ELEMENTS) {
        LY_CHECK_RET(yin_parse_maxelements(ctx, lim, flags, exts));
    } else {
        LY_CHECK_RET(yin_parse_minelements(ctx, lim, flags, exts));
    }

    return LY_SUCCESS;
}